

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O3

void context_proc(sc_transfer_t transfer)

{
  context_data *pcVar1;
  context_data *data;
  undefined1 auVar2 [16];
  
  data = (context_data *)transfer.data;
  if (data != (context_data *)0x0) {
    auVar2 = sc_jump_context(transfer.ctx,0);
    pcVar1 = sc_get_curr_context_data();
    if (pcVar1 == (context_data *)0x0) {
      pcVar1 = sc_get_main_context_data();
    }
    pcVar1->ctx = auVar2._0_8_;
    sc_set_curr_context_data(data);
    data->ctx = (sc_context_sp_t)0x0;
    (*data->proc)(auVar2._8_8_);
    return;
  }
  __assert_fail("data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",0x23,
                "void context_proc(sc_transfer_t)");
}

Assistant:

static void context_proc (sc_transfer_t transfer) {
    context_data* data = (context_data*)transfer.data;
    assert(data != NULL);

    /* Jump back to parent */
    transfer = sc_jump_context(transfer.ctx, NULL);

    /* Update the current context */
    sc_current_context()->ctx = transfer.ctx;
    sc_set_curr_context_data(data);
    data->ctx = NULL;

    /* Execute the context proc */
    data->proc(transfer.data);
}